

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_prngstate(lua_State *L)

{
  TValue *pTVar1;
  MSize MVar2;
  GCtab *t_00;
  GCtab *t_01;
  cTValue *local_120;
  TValue *local_118;
  TValue *local_110;
  cTValue *v;
  int len;
  int i_1;
  GCtab *t;
  TValue *o;
  PRNGState prng;
  jit_State *J;
  int i;
  GCtab *cur;
  lua_State *L_local;
  
  t_00 = lj_tab_new(L,8,0);
  prng.u[3] = (L->glref).ptr64 + 0x2e0;
  for (J._4_4_ = 1; J._4_4_ < 5; J._4_4_ = J._4_4_ + 1) {
    if (J._4_4_ * 2 - 1U < t_00->asize) {
      local_110 = (TValue *)((t_00->array).ptr64 + (long)(J._4_4_ * 2 + -1) * 8);
    }
    else {
      local_110 = lj_tab_setinth(L,t_00,J._4_4_ * 2 + -1);
    }
    local_110->n = (double)(int)*(undefined8 *)(prng.u[3] + 0xc28 + (long)(J._4_4_ + -1) * 8);
    if ((uint)(J._4_4_ << 1) < t_00->asize) {
      local_118 = (TValue *)((t_00->array).ptr64 + (long)(J._4_4_ << 1) * 8);
    }
    else {
      local_118 = lj_tab_setinth(L,t_00,J._4_4_ << 1);
    }
    local_118->n = (double)(int)((ulong)*(undefined8 *)
                                         (prng.u[3] + 0xc28 + (long)(J._4_4_ + -1) * 8) >> 0x20);
  }
  if ((L->base < L->top) && (L->base->u64 != 0xffffffffffffffff)) {
    if ((uint)((int)(L->base->field_4).it >> 0xf) < 0xfffffff3) {
      pTVar1 = L->base;
      if (((double)((long)pTVar1->n & 0xffffffff) != pTVar1->n) ||
         (NAN((double)((long)pTVar1->n & 0xffffffff)) || NAN(pTVar1->n))) {
        lj_err_arg(L,1,LJ_ERR_PRNGSTATE);
      }
      o = (TValue *)(long)(int)pTVar1->n;
      for (J._4_4_ = 1; J._4_4_ < 4; J._4_4_ = J._4_4_ + 1) {
        prng.u[(long)J._4_4_ + -1] = 0;
      }
    }
    else {
      t_01 = lj_lib_checktab(L,1);
      MVar2 = lj_tab_len(t_01);
      if (8 < (int)MVar2) {
        lj_err_arg(L,1,LJ_ERR_PRNGSTATE);
      }
      for (v._4_4_ = 1; (int)v._4_4_ <= (int)MVar2; v._4_4_ = v._4_4_ + 1) {
        if (v._4_4_ < t_01->asize) {
          local_120 = (cTValue *)((t_01->array).ptr64 + (long)(int)v._4_4_ * 8);
        }
        else {
          local_120 = lj_tab_getinth(t_01,v._4_4_);
        }
        if (((0xfffffff1 < (uint)((int)(local_120->field_4).it >> 0xf)) ||
            ((double)((long)local_120->n & 0xffffffff) != local_120->n)) ||
           (NAN((double)((long)local_120->n & 0xffffffff)) || NAN(local_120->n))) {
          lj_err_arg(L,1,LJ_ERR_PRNGSTATE);
        }
        if ((v._4_4_ & 1) == 0) {
          prng.u[(long)((int)(v._4_4_ - 1) / 2) + -1] =
               prng.u[(long)((int)(v._4_4_ - 1) / 2) + -1] | (long)(int)local_120->n << 0x20;
        }
        else {
          prng.u[(long)((int)(v._4_4_ - 1) / 2) + -1] = (long)(int)local_120->n;
        }
      }
      for (v._4_4_ = (int)v._4_4_ / 2; (int)v._4_4_ < 4; v._4_4_ = v._4_4_ + 1) {
        prng.u[(long)(int)v._4_4_ + -1] = 0;
      }
    }
    *(TValue **)(prng.u[3] + 0xc28) = o;
    *(uint64_t *)(prng.u[3] + 0xc30) = prng.u[0];
    *(uint64_t *)(prng.u[3] + 0xc38) = prng.u[1];
    *(uint64_t *)(prng.u[3] + 0xc40) = prng.u[2];
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->u64 = (ulong)t_00 | 0xfffa000000000000;
  return 1;
}

Assistant:

LJLIB_CF(jit_prngstate)
{
  GCtab *cur = lj_tab_new(L, 8, 0);

#if LJ_HASJIT
  int i;
  jit_State *J = L2J(L);

  /* The old state. */
  for (i = 1; i <= 4; i++) {
    setintV(lj_tab_setint(L, cur, i*2-1), J->prng.u[i-1] & 0xffffffff);
    setintV(lj_tab_setint(L, cur, i*2), J->prng.u[i-1] >> 32);
  }

  /* We need to set new state using the input array. */
  if (L->base < L->top && !tvisnil(L->base)) {
    PRNGState prng;
    if (tvisnumber(L->base)) {
      TValue *o = L->base;

      if (!tvisint(o) && ((double)(uint32_t)numV(o) != numV(o)))
        lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

      prng.u[0] = numberVint(o);
      for (i = 1; i < 4; i++)
        prng.u[i] = 0;
    } else {
      GCtab *t = lj_lib_checktab(L, 1);
      int i = 1, len = lj_tab_len(t);

      /* The input array must have at most 8 elements. */
      if (len > 8)
        lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

      for (i = 1; i <= len; i++) {
        cTValue *v = lj_tab_getint(t, i);

        if (!tvisint(v) && (!tvisnum(v) || (double)(uint32_t)numV(v) != numV(v)))
          lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

        if (i & 1)
          prng.u[(i-1)/2] = numberVint(v);
        else
          prng.u[(i-1)/2] = prng.u[(i-1)/2] | ((uint64_t)numberVint(v) << 32);
      }
      for (i /= 2; i < 4; i++)
        prng.u[i] = 0;
    }

    /* Re-initialize the JIT prng. */
    J->prng = prng;
  }
#else
  for (int i = 1; i <= 8; i++)
    setintV(lj_tab_setint(L, cur, i), 0);
#endif
  settabV(L, L->top++, cur);
  return 1;
}